

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Disk::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Disk *this,Point2f *u)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  Transform *pTVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 local_28 [16];
  Interval<float> local_18;
  
  fVar9 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  fVar12 = (u->super_Tuple2<pbrt::Point2,_float>).y;
  auVar10._0_4_ = fVar9 + fVar9;
  auVar10._4_4_ = fVar12 + fVar12;
  auVar10._8_8_ = 0;
  auVar14._8_4_ = 0xbf800000;
  auVar14._0_8_ = 0xbf800000bf800000;
  auVar14._12_4_ = 0xbf800000;
  auVar10 = vaddps_avx512vl(auVar10,auVar14);
  fVar12 = auVar10._0_4_;
  auVar14 = vmovshdup_avx(auVar10);
  fVar9 = auVar14._0_4_;
  if (fVar12 == 0.0) {
    auVar14 = ZEXT816(0) << 0x40;
    if ((fVar9 == 0.0) && (!NAN(fVar9))) goto LAB_0037a21e;
  }
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar10,auVar11);
  auVar23._0_4_ = fVar12 / fVar9;
  auVar23._4_12_ = auVar10._4_12_;
  auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar23,ZEXT416(0x3fc90fdb));
  auVar14 = vshufps_avx(auVar11,auVar11,0xf5);
  bVar6 = auVar14._0_4_ < auVar11._0_4_;
  fVar8 = (float)((uint)bVar6 * (int)((fVar9 / fVar12) * 0.7853982) + (uint)!bVar6 * auVar10._0_4_);
  fVar9 = (float)((uint)bVar6 * (int)fVar12 + (uint)!bVar6 * (int)fVar9);
  fVar12 = cosf(fVar8);
  fVar8 = sinf(fVar8);
  auVar14 = vinsertps_avx(ZEXT416((uint)(fVar9 * fVar12)),ZEXT416((uint)(fVar9 * fVar8)),0x10);
LAB_0037a21e:
  FVar1 = this->height;
  auVar18._4_4_ = FVar1;
  auVar18._0_4_ = FVar1;
  auVar18._8_4_ = FVar1;
  auVar18._12_4_ = FVar1;
  fVar9 = auVar14._0_4_ * this->radius;
  auVar14 = vmovshdup_avx(auVar14);
  fVar12 = auVar14._0_4_ * this->radius;
  auVar15._4_4_ = fVar9;
  auVar15._0_4_ = fVar9;
  auVar15._8_4_ = fVar9;
  auVar15._12_4_ = fVar9;
  auVar13._4_4_ = fVar12;
  auVar13._0_4_ = fVar12;
  auVar13._8_4_ = fVar12;
  auVar13._12_4_ = fVar12;
  local_28 = vmovlhps_avx(auVar15,auVar13);
  local_18 = (Interval<float>)vmovlps_avx(auVar18);
  Transform::operator()
            ((Point3fi *)__return_storage_ptr__,this->renderFromObject,(Point3fi *)local_28);
  pTVar7 = this->renderFromObject;
  bVar6 = this->reverseOrientation;
  uVar4 = *(undefined8 *)(pTVar7->mInv).m[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(pTVar7->mInv).m[0];
  uVar5 = *(undefined8 *)(pTVar7->mInv).m[2];
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->mInv).m[1][2] * 0.0)),ZEXT816(0) << 0x40,
                            ZEXT416((uint)(pTVar7->mInv).m[0][2]));
  auVar10 = ZEXT416(0) << 0x40;
  fVar9 = auVar14._0_4_ + (pTVar7->mInv).m[2][2];
  auVar21._0_4_ = (float)uVar4 * 0.0;
  auVar21._4_4_ = (float)((ulong)uVar4 >> 0x20) * 0.0;
  auVar21._8_8_ = 0;
  auVar14 = vfmadd231ps_fma(auVar21,auVar10,auVar19);
  auVar20._0_4_ = (float)uVar5 + auVar14._0_4_;
  auVar20._4_4_ = (float)((ulong)uVar5 >> 0x20) + auVar14._4_4_;
  auVar20._8_4_ = auVar14._8_4_ + 0.0;
  auVar20._12_4_ = auVar14._12_4_ + 0.0;
  auVar22._0_4_ = auVar20._0_4_ * auVar20._0_4_;
  auVar22._4_4_ = auVar20._4_4_ * auVar20._4_4_;
  auVar22._8_4_ = auVar20._8_4_ * auVar20._8_4_;
  auVar22._12_4_ = auVar20._12_4_ * auVar20._12_4_;
  auVar14 = vhaddps_avx(auVar22,auVar22);
  auVar14 = ZEXT416((uint)(auVar14._0_4_ + fVar9 * fVar9));
  auVar14 = vsqrtss_avx(auVar14,auVar14);
  fVar12 = auVar14._0_4_;
  auVar16._4_4_ = fVar12;
  auVar16._0_4_ = fVar12;
  auVar16._8_4_ = fVar12;
  auVar16._12_4_ = fVar12;
  auVar14 = vdivps_avx(auVar20,auVar16);
  auVar17 = auVar14;
  if (bVar6 != false) {
    auVar17._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
    auVar17._8_4_ = auVar14._8_4_ ^ 0x80000000;
    auVar17._12_4_ = auVar14._12_4_ ^ 0x80000000;
  }
  fVar8 = this->radius;
  fVar2 = this->innerRadius;
  fVar3 = this->phiMax;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar10;
  uVar4 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar4;
  *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       (uint)(bVar6 & 1) * (int)-(fVar9 / fVar12) + (uint)!(bool)(bVar6 & 1) * (int)(fVar9 / fVar12)
  ;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar10;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / (fVar3 * 0.5 * (fVar8 * fVar8 - fVar2 * fVar2));
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const Point2f &u) const {
        Point2f pd = SampleUniformDiskConcentric(u);
        Point3f pObj(pd.x * radius, pd.y * radius, height);
        Point3fi pi = (*renderFromObject)(Point3fi(pObj));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(0, 0, 1)));
        if (reverseOrientation)
            n *= -1;
        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }